

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deffunc.cpp
# Opt level: O0

ObjectPtr __thiscall
ICM::DefFunc::Convert::StringToNumber::func(StringToNumber *this,DataList *list)

{
  Type TVar1;
  Object **ppOVar2;
  Ty<9UL> *this_00;
  char *pcVar3;
  Type *pTVar4;
  Object *obj;
  lightlist<ICM::Object_*> *in_RDX;
  allocator local_59;
  string local_58;
  Rational<long_long> local_38;
  Type local_28;
  NumberType num;
  DataList *list_local;
  StringToNumber *this_local;
  
  list_local = list;
  this_local = this;
  ppOVar2 = Common::lightlist<ICM::Object_*>::operator[](in_RDX,0);
  this_00 = Object::dat<9ul>(*ppOVar2);
  pcVar3 = Compiler::Literal::StringType::c_str(this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,pcVar3,&local_59);
  local_38 = Common::Number::to_rational<long_long>(&local_58);
  pTVar4 = Common::Number::Rational<long_long>::num(&local_38);
  TVar1 = *pTVar4;
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  local_28 = TVar1;
  obj = (Object *)operator_new(0x10);
  Objects::DataObject<(ICM::DefaultType)8>::DataObject
            ((DataObject<(ICM::DefaultType)8> *)obj,&local_28);
  ObjectPtr::ObjectPtr((ObjectPtr *)this,obj);
  return (ObjectPtr)(Object *)this;
}

Assistant:

ObjectPtr func(const DataList &list) const {
					TypeBase::NumberType num = (TypeBase::NumberType)Common::Number::to_rational<long long>(list[0]->dat<T_String>().c_str()).num();
					return ObjectPtr(new Objects::Number(num));
				}